

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib536.c
# Opt level: O2

int test(char *URL)

{
  uint uVar1;
  CURLM *multi;
  long lVar2;
  undefined8 uVar3;
  ulong uVar4;
  char *pcVar5;
  FILE *pFVar6;
  undefined8 uStack_30;
  
  tv_test_start = tutil_tvnow();
  uVar1 = curl_global_init(3);
  pFVar6 = _stderr;
  if (uVar1 != 0) {
    uVar3 = curl_easy_strerror(uVar1);
    fprintf(pFVar6,"%s:%d curl_global_init() failed, with code %d (%s)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib536.c"
            ,0x56,(ulong)uVar1,uVar3);
    goto LAB_00102626;
  }
  multi = (CURLM *)curl_multi_init();
  if (multi == (CURLM *)0x0) {
    fprintf(_stderr,"%s:%d curl_multi_init() failed\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib536.c"
            ,0x58);
    uVar1 = 0x7b;
LAB_00102484:
    lVar2 = 0;
  }
  else {
    lVar2 = curl_easy_init();
    if (lVar2 == 0) {
      fprintf(_stderr,"%s:%d curl_easy_init() failed\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib536.c"
              ,0x5a);
      uVar1 = 0x7c;
      goto LAB_00102484;
    }
    uVar1 = curl_multi_setopt(multi,3,1);
    pFVar6 = _stderr;
    if (uVar1 == 0) {
      uVar1 = curl_easy_setopt(lVar2,0x4e2b,fwrite);
      pFVar6 = _stderr;
      if (uVar1 != 0) {
        uVar4 = (ulong)uVar1;
        uVar3 = curl_easy_strerror(uVar1);
        pcVar5 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        uStack_30 = 0x5e;
        goto LAB_001025b2;
      }
      uVar1 = curl_easy_setopt(lVar2,0x2d,1);
      pFVar6 = _stderr;
      if (uVar1 != 0) {
        uVar4 = (ulong)uVar1;
        uVar3 = curl_easy_strerror(uVar1);
        pcVar5 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        uStack_30 = 0x5f;
        goto LAB_001025b2;
      }
      uVar1 = curl_easy_setopt(lVar2,0x2712,URL);
      pFVar6 = _stderr;
      if (uVar1 != 0) {
        uVar4 = (ulong)uVar1;
        uVar3 = curl_easy_strerror(uVar1);
        pcVar5 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        uStack_30 = 0x60;
        goto LAB_001025b2;
      }
      uVar1 = curl_multi_add_handle(multi,lVar2);
      pFVar6 = _stderr;
      if (uVar1 == 0) {
        uVar1 = perform(multi);
        if (uVar1 != 0) {
          pcVar5 = "retrieve 1 failed";
          goto LAB_00102600;
        }
        curl_multi_remove_handle(multi,lVar2);
        curl_easy_reset(lVar2);
        uVar1 = curl_easy_setopt(lVar2,0x2d,1);
        pFVar6 = _stderr;
        if (uVar1 != 0) {
          uVar4 = (ulong)uVar1;
          uVar3 = curl_easy_strerror(uVar1);
          pcVar5 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
          uStack_30 = 0x72;
          goto LAB_001025b2;
        }
        uVar1 = curl_easy_setopt(lVar2,0x2712,libtest_arg2);
        pFVar6 = _stderr;
        if (uVar1 != 0) {
          uVar4 = (ulong)uVar1;
          uVar3 = curl_easy_strerror(uVar1);
          pcVar5 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
          uStack_30 = 0x73;
          goto LAB_001025b2;
        }
        uVar1 = curl_multi_add_handle(multi,lVar2);
        pFVar6 = _stderr;
        if (uVar1 != 0) {
          uVar3 = curl_multi_strerror(uVar1);
          fprintf(pFVar6,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib536.c"
                  ,0x75,(ulong)uVar1,uVar3);
          pcVar5 = "curl_multi_add_handle() 2 failed";
          goto LAB_00102600;
        }
        uVar1 = perform(multi);
        if (uVar1 != 0) {
          pcVar5 = "retrieve 2 failed";
          goto LAB_00102600;
        }
        curl_multi_remove_handle(multi,lVar2);
        uVar1 = 0;
      }
      else {
        uVar3 = curl_multi_strerror(uVar1);
        fprintf(pFVar6,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib536.c"
                ,0x62,(ulong)uVar1,uVar3);
        pcVar5 = "curl_multi_add_handle() 1 failed";
LAB_00102600:
        puts(pcVar5);
      }
    }
    else {
      uVar4 = (ulong)uVar1;
      uVar3 = curl_multi_strerror(uVar1);
      pcVar5 = "%s:%d curl_multi_setopt() failed, with code %d (%s)\n";
      uStack_30 = 0x5c;
LAB_001025b2:
      uVar1 = (uint)uVar4;
      fprintf(pFVar6,pcVar5,
              "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib536.c"
              ,uStack_30,uVar4,uVar3);
    }
  }
  curl_easy_cleanup(lVar2);
  curl_multi_cleanup(multi);
  curl_global_cleanup();
  puts("Finished!");
LAB_00102626:
  return uVar1;
}

Assistant:

int test(char *URL)
{
  CURLM *multi = NULL;
  CURL *easy = NULL;
  int res = 0;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  multi_init(multi);

  easy_init(easy);

  multi_setopt(multi, CURLMOPT_PIPELINING, 1L);

  easy_setopt(easy, CURLOPT_WRITEFUNCTION, fwrite);
  easy_setopt(easy, CURLOPT_FAILONERROR, 1L);
  easy_setopt(easy, CURLOPT_URL, URL);

  res_multi_add_handle(multi, easy);
  if(res) {
    printf("curl_multi_add_handle() 1 failed\n");
    goto test_cleanup;
  }

  res = perform(multi);
  if(res) {
    printf("retrieve 1 failed\n");
    goto test_cleanup;
  }

  curl_multi_remove_handle(multi, easy);

  curl_easy_reset(easy);

  easy_setopt(easy, CURLOPT_FAILONERROR, 1L);
  easy_setopt(easy, CURLOPT_URL, libtest_arg2);

  res_multi_add_handle(multi, easy);
  if(res) {
    printf("curl_multi_add_handle() 2 failed\n");
    goto test_cleanup;
  }

  res = perform(multi);
  if(res) {
    printf("retrieve 2 failed\n");
    goto test_cleanup;
  }

  curl_multi_remove_handle(multi, easy);

test_cleanup:

  /* undocumented cleanup sequence - type UB */

  curl_easy_cleanup(easy);
  curl_multi_cleanup(multi);
  curl_global_cleanup();

  printf("Finished!\n");

  return res;
}